

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O3

void buffer_empty(Buffer *buffer)

{
  BufferBlock *pBVar1;
  BufferBlock *pBVar2;
  
  pBVar2 = buffer->head;
  while (pBVar2 != (BufferBlock *)0x0) {
    pBVar1 = pBVar2->next;
    (*buffer->f)(pBVar2,buffer->d);
    pBVar2 = pBVar1;
  }
  buffer->total_bytes = 0;
  buffer->head = (BufferBlock *)0x0;
  buffer->tail = (BufferBlock *)0x0;
  return;
}

Assistant:

void buffer_empty(Buffer *buffer)
{
    BufferBlock *item = buffer->head;
    while (item != NULL)
    {
        BufferBlock *next = item->next;
        buffer->f(item, buffer->d);
        item = next;
    } // while
    buffer->head = buffer->tail = NULL;
    buffer->total_bytes = 0;
}